

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O2

int ARKStepResVtolerance(void *arkode_mem,N_Vector rabstol)

{
  int iVar1;
  char *pcVar2;
  realtype rVar3;
  
  if (arkode_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::ARKStep","ARKStepResVtolerance",
                    "arkode_mem = NULL illegal.");
    return -0x15;
  }
  if (arkode_mem == (void *)0x0) {
    pcVar2 = "arkode_mem = NULL illegal.";
    iVar1 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
  }
  else {
    if (*(int *)((long)arkode_mem + 0x250) == 0) {
      pcVar2 = "Attempt to call before ARKodeInit.";
    }
    else {
      if (rabstol != (N_Vector)0x0) {
        if (rabstol->ops->nvmin == (_func_realtype_N_Vector *)0x0) {
          pcVar2 = "Missing N_VMin routine from N_Vector";
        }
        else {
          rVar3 = N_VMin(rabstol);
          if (0.0 <= rVar3) {
            *(uint *)((long)arkode_mem + 0x50) = -(uint)(rVar3 == 0.0) & 1;
            if (*(int *)((long)arkode_mem + 0x100) != 0) {
              *(undefined8 *)((long)arkode_mem + 0xf8) = 0;
              iVar1 = arkAllocVec((ARKodeMem)arkode_mem,*(N_Vector *)((long)arkode_mem + 0xf0),
                                  (N_Vector *)((long)arkode_mem + 0xf8));
              if (iVar1 == 0) {
                pcVar2 = "arkResVtolerances";
                goto LAB_004b5297;
              }
              *(undefined4 *)((long)arkode_mem + 0x100) = 0;
            }
            if (*(int *)((long)arkode_mem + 0x24c) == 0) {
              iVar1 = arkAllocVec((ARKodeMem)arkode_mem,*(N_Vector *)((long)arkode_mem + 0xf8),
                                  (N_Vector *)((long)arkode_mem + 0x48));
              if (iVar1 == 0) {
                pcVar2 = "arkResStolerances";
LAB_004b5297:
                arkProcessError((ARKodeMem)arkode_mem,-0x14,"ARKode",pcVar2,
                                "Allocation of arkode_mem failed.");
                return -0x16;
              }
              *(undefined4 *)((long)arkode_mem + 0x24c) = 1;
            }
            N_VScale(1.0,rabstol,*(N_Vector *)((long)arkode_mem + 0x48));
            *(undefined4 *)((long)arkode_mem + 0x1c) = 1;
            *(undefined4 *)((long)arkode_mem + 0x54) = 0;
            *(code **)((long)arkode_mem + 0x70) = arkRwtSet;
            *(void **)((long)arkode_mem + 0x78) = arkode_mem;
            return 0;
          }
          pcVar2 = "rabstol has negative component(s) (illegal).";
        }
        iVar1 = -0x16;
        goto LAB_004b51c8;
      }
      pcVar2 = "rabstol = NULL illegal.";
    }
    iVar1 = -0x17;
  }
LAB_004b51c8:
  arkProcessError((ARKodeMem)arkode_mem,iVar1,"ARKode","arkResVtolerance",pcVar2);
  return iVar1;
}

Assistant:

int ARKStepResVtolerance(void *arkode_mem, N_Vector rabstol)
{
  /* unpack ark_mem, call arkResVtolerance, and return */
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ARKStep",
                    "ARKStepResVtolerance", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  return(arkResVtolerance(ark_mem, rabstol));
}